

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

AggregateFunction * duckdb::GetReservoirQuantileListAggregateFunction(LogicalType *type)

{
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  NotImplementedException *pNVar3;
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  LogicalType *in_stack_ffffffffffffff58;
  allocator *paVar4;
  allocator local_69;
  string local_68 [35];
  undefined1 local_45;
  allocator local_31;
  string local_30 [32];
  LogicalType *local_10;
  
  local_10 = in_RSI;
  LVar1 = LogicalType::id(in_RSI);
  switch(LVar1) {
  case TINYINT:
    GetTypedReservoirQuantileListAggregateFunction<signed_char,signed_char>
              (in_stack_ffffffffffffff58);
    break;
  case SMALLINT:
    GetTypedReservoirQuantileListAggregateFunction<short,short>(in_stack_ffffffffffffff58);
    break;
  case INTEGER:
    GetTypedReservoirQuantileListAggregateFunction<int,int>(in_stack_ffffffffffffff58);
    break;
  case BIGINT:
    GetTypedReservoirQuantileListAggregateFunction<long,long>(in_stack_ffffffffffffff58);
    break;
  default:
    pNVar3 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    paVar4 = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Unimplemented reservoir quantile list aggregate",paVar4);
    duckdb::NotImplementedException::NotImplementedException(pNVar3,local_68);
    __cxa_throw(pNVar3,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  case DECIMAL:
    PVar2 = LogicalType::InternalType(local_10);
    if (PVar2 == INT128) {
      GetTypedReservoirQuantileListAggregateFunction<duckdb::hugeint_t,duckdb::hugeint_t>
                (in_stack_ffffffffffffff58);
    }
    else if (PVar2 == INT16) {
      GetTypedReservoirQuantileListAggregateFunction<short,short>(in_stack_ffffffffffffff58);
    }
    else if (PVar2 == INT32) {
      GetTypedReservoirQuantileListAggregateFunction<int,int>(in_stack_ffffffffffffff58);
    }
    else {
      if (PVar2 != INT64) {
        local_45 = 1;
        pNVar3 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_30,"Unimplemented reservoir quantile list aggregate",&local_31);
        duckdb::NotImplementedException::NotImplementedException(pNVar3,local_30);
        local_45 = 0;
        __cxa_throw(pNVar3,&NotImplementedException::typeinfo,
                    NotImplementedException::~NotImplementedException);
      }
      GetTypedReservoirQuantileListAggregateFunction<long,long>(in_stack_ffffffffffffff58);
    }
    break;
  case FLOAT:
    GetTypedReservoirQuantileListAggregateFunction<float,float>(in_stack_ffffffffffffff58);
    break;
  case DOUBLE:
    GetTypedReservoirQuantileListAggregateFunction<double,double>(in_stack_ffffffffffffff58);
    break;
  case HUGEINT:
    GetTypedReservoirQuantileListAggregateFunction<duckdb::hugeint_t,duckdb::hugeint_t>
              (in_stack_ffffffffffffff58);
  }
  return in_RDI;
}

Assistant:

AggregateFunction GetReservoirQuantileListAggregateFunction(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::TINYINT:
		return GetTypedReservoirQuantileListAggregateFunction<int8_t, int8_t>(type);
	case LogicalTypeId::SMALLINT:
		return GetTypedReservoirQuantileListAggregateFunction<int16_t, int16_t>(type);
	case LogicalTypeId::INTEGER:
		return GetTypedReservoirQuantileListAggregateFunction<int32_t, int32_t>(type);
	case LogicalTypeId::BIGINT:
		return GetTypedReservoirQuantileListAggregateFunction<int64_t, int64_t>(type);
	case LogicalTypeId::HUGEINT:
		return GetTypedReservoirQuantileListAggregateFunction<hugeint_t, hugeint_t>(type);
	case LogicalTypeId::FLOAT:
		return GetTypedReservoirQuantileListAggregateFunction<float, float>(type);
	case LogicalTypeId::DOUBLE:
		return GetTypedReservoirQuantileListAggregateFunction<double, double>(type);
	case LogicalTypeId::DECIMAL:
		switch (type.InternalType()) {
		case PhysicalType::INT16:
			return GetTypedReservoirQuantileListAggregateFunction<int16_t, int16_t>(type);
		case PhysicalType::INT32:
			return GetTypedReservoirQuantileListAggregateFunction<int32_t, int32_t>(type);
		case PhysicalType::INT64:
			return GetTypedReservoirQuantileListAggregateFunction<int64_t, int64_t>(type);
		case PhysicalType::INT128:
			return GetTypedReservoirQuantileListAggregateFunction<hugeint_t, hugeint_t>(type);
		default:
			throw NotImplementedException("Unimplemented reservoir quantile list aggregate");
		}
	default:
		// TODO: Add quantitative temporal types
		throw NotImplementedException("Unimplemented reservoir quantile list aggregate");
	}
}